

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512fp16.cpp
# Opt level: O1

void ncnn::cast_fp16_to_fp32_sse_avx512fp16(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 (*pauVar6) [32];
  long lVar7;
  long lVar8;
  undefined1 (*pauVar9) [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  float fVar13;
  
  iVar1 = bottom_blob->c;
  if (0 < (long)iVar1) {
    uVar5 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar7 = 0;
    do {
      pauVar6 = (undefined1 (*) [32])
                (bottom_blob->cstep * lVar7 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar9 = (undefined1 (*) [64])
                (top_blob->cstep * lVar7 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar5 < 0x10) {
        uVar3 = 0;
      }
      else {
        iVar2 = 0xf;
        do {
          auVar12 = vcvtph2psx_avx512fp16(*pauVar6);
          *pauVar9 = auVar12;
          pauVar6 = pauVar6 + 1;
          pauVar9 = pauVar9 + 1;
          iVar2 = iVar2 + 0x10;
          uVar3 = uVar5 & 0xfffffff0;
        } while (iVar2 < (int)uVar5);
      }
      uVar4 = uVar3 | 7;
      while ((int)uVar4 < (int)uVar5) {
        auVar11 = vcvtph2psx_avx512fp16(*(undefined1 (*) [16])*pauVar6);
        *(undefined1 (*) [32])*pauVar9 = auVar11;
        pauVar6 = (undefined1 (*) [32])(*pauVar6 + 0x10);
        pauVar9 = (undefined1 (*) [64])((long)*pauVar9 + 0x20);
        uVar4 = uVar3 + 0xf;
        uVar3 = uVar3 + 8;
      }
      uVar4 = uVar3 | 3;
      while ((int)uVar4 < (int)uVar5) {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *(ulong *)*pauVar6;
        auVar10 = vcvtph2psx_avx512fp16(auVar10);
        *(undefined1 (*) [16])*pauVar9 = auVar10;
        pauVar6 = (undefined1 (*) [32])(*pauVar6 + 8);
        pauVar9 = (undefined1 (*) [64])((long)*pauVar9 + 0x10);
        uVar4 = uVar3 + 7;
        uVar3 = uVar3 + 4;
      }
      if (uVar5 - uVar3 != 0 && (int)uVar3 <= (int)uVar5) {
        lVar8 = 0;
        do {
          fVar13 = float16_to_float32(*(unsigned_short *)(*pauVar6 + lVar8 * 2));
          *(float *)((long)*pauVar9 + lVar8 * 4) = fVar13;
          lVar8 = lVar8 + 1;
        } while (uVar5 - uVar3 != (int)lVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

void cast_fp16_to_fp32_sse_avx512fp16(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
}